

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error asmjit::CodeHolder_reserveInternal(CodeHolder *self,CodeBuffer *cb,size_t n)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  Error EVar4;
  uint8_t *puVar5;
  ulong uVar6;
  long lVar7;
  
  if ((cb->_data == (uint8_t *)0x0) || ((cb->_flags & 1) != 0)) {
    puVar5 = (uint8_t *)malloc(n);
  }
  else {
    puVar5 = (uint8_t *)realloc(cb->_data,n);
  }
  if (puVar5 == (uint8_t *)0x0) {
    EVar4 = 1;
  }
  else {
    cb->_data = puVar5;
    cb->_capacity = n;
    uVar6 = (ulong)(self->_emitters).super_ZoneVectorBase._size;
    if (uVar6 != 0) {
      pvVar1 = (self->_emitters).super_ZoneVectorBase._data;
      lVar7 = 0;
      do {
        lVar2 = *(long *)((long)pvVar1 + lVar7);
        if ((*(char *)(lVar2 + 8) == '\x01') &&
           ((CodeBuffer *)(*(long *)(lVar2 + 0x50) + 0x48) == cb)) {
          lVar3 = *(long *)(lVar2 + 0x58);
          *(uint8_t **)(lVar2 + 0x58) = puVar5;
          *(uint8_t **)(lVar2 + 0x60) = puVar5 + n;
          *(uint8_t **)(lVar2 + 0x68) = puVar5 + (*(long *)(lVar2 + 0x68) - lVar3);
        }
        lVar7 = lVar7 + 8;
      } while (uVar6 << 3 != lVar7);
    }
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

static Error CodeHolder_reserveInternal(CodeHolder* self, CodeBuffer* cb, size_t n) noexcept {
  uint8_t* oldData = cb->_data;
  uint8_t* newData;

  if (oldData && !cb->isExternal())
    newData = static_cast<uint8_t*>(::realloc(oldData, n));
  else
    newData = static_cast<uint8_t*>(::malloc(n));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  cb->_data = newData;
  cb->_capacity = n;

  // Update pointers used by assemblers, if attached.
  for (BaseEmitter* emitter : self->emitters()) {
    if (emitter->isAssembler()) {
      BaseAssembler* a = static_cast<BaseAssembler*>(emitter);
      if (&a->_section->_buffer == cb) {
        size_t offset = a->offset();

        a->_bufferData = newData;
        a->_bufferEnd  = newData + n;
        a->_bufferPtr  = newData + offset;
      }
    }
  }

  return kErrorOk;
}